

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

int amqp_frame_to_bytes(amqp_frame_t *frame,amqp_bytes_t buffer,amqp_bytes_t *encoded)

{
  byte val;
  amqp_bytes_t encoded_00;
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  long *in_RCX;
  void *in_RDX;
  long in_RSI;
  byte *in_RDI;
  amqp_bytes_t properties_encoded;
  amqp_bytes_t method_encoded;
  amqp_bytes_t *body;
  int res;
  size_t out_frame_len;
  void *out_frame;
  void *in_stack_00000140;
  amqp_method_number_t in_stack_0000014c;
  undefined1 in_stack_00000150 [16];
  void *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  uint16_t in_stack_ffffffffffffff76;
  void *in_stack_ffffffffffffffa8;
  size_t local_38;
  
  val = *in_RDI;
  pvVar2 = amqp_offset(in_RDX,0);
  amqp_e8(val,pvVar2);
  amqp_offset(in_RDX,1);
  amqp_e16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff68);
  pvVar2 = (void *)(ulong)(*in_RDI - 1);
  switch(pvVar2) {
  case (void *)0x0:
    amqp_offset(in_RDX,7);
    amqp_e32(CONCAT22(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74),in_stack_ffffffffffffff68
            );
    amqp_offset(in_RDX,0xb);
    iVar1 = amqp_encode_method(in_stack_0000014c,in_stack_00000140,(amqp_bytes_t)in_stack_00000150);
    if (iVar1 < 0) {
      return iVar1;
    }
    local_38 = (size_t)(iVar1 + 4);
    break;
  case (void *)0x1:
    in_stack_ffffffffffffff76 = *(uint16_t *)(in_RDI + 8);
    amqp_offset(in_RDX,7);
    amqp_e16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff68);
    amqp_offset(in_RDX,9);
    amqp_e16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff68);
    amqp_offset(in_RDX,0xb);
    amqp_e64(CONCAT26(in_stack_ffffffffffffff76,
                      CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)),
             in_stack_ffffffffffffff68);
    pvVar3 = amqp_offset(in_RDX,0x13);
    encoded_00.bytes = in_stack_ffffffffffffffa8;
    encoded_00.len = (size_t)pvVar3;
    iVar1 = amqp_encode_properties((uint16_t)((ulong)(in_RSI + -0x14) >> 0x30),pvVar2,encoded_00);
    if (iVar1 < 0) {
      return iVar1;
    }
    local_38 = (size_t)(iVar1 + 0xc);
    break;
  case (void *)0x2:
    pvVar2 = amqp_offset(in_RDX,7);
    memcpy(pvVar2,*(void **)(in_RDI + 0x10),*(size_t *)(in_RDI + 8));
    local_38 = *(size_t *)(in_RDI + 8);
    break;
  default:
    return -10;
  case (void *)0x7:
    local_38 = 0;
  }
  amqp_offset(in_RDX,3);
  amqp_e32(CONCAT22(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74),in_stack_ffffffffffffff68);
  pvVar2 = amqp_offset(in_RDX,local_38 + 7);
  amqp_e8(0xce,pvVar2);
  in_RCX[1] = (long)in_RDX;
  *in_RCX = local_38 + 8;
  return 0;
}

Assistant:

static int amqp_frame_to_bytes(const amqp_frame_t *frame, amqp_bytes_t buffer,
                               amqp_bytes_t *encoded) {
  void *out_frame = buffer.bytes;
  size_t out_frame_len;
  int res;

  amqp_e8(frame->frame_type, amqp_offset(out_frame, 0));
  amqp_e16(frame->channel, amqp_offset(out_frame, 1));

  switch (frame->frame_type) {
    case AMQP_FRAME_BODY: {
      const amqp_bytes_t *body = &frame->payload.body_fragment;

      memcpy(amqp_offset(out_frame, HEADER_SIZE), body->bytes, body->len);

      out_frame_len = body->len;
      break;
    }
    case AMQP_FRAME_METHOD: {
      amqp_bytes_t method_encoded;

      amqp_e32(frame->payload.method.id, amqp_offset(out_frame, HEADER_SIZE));

      method_encoded.bytes = amqp_offset(out_frame, HEADER_SIZE + 4);
      method_encoded.len = buffer.len - HEADER_SIZE - 4 - FOOTER_SIZE;

      res = amqp_encode_method(frame->payload.method.id,
                               frame->payload.method.decoded, method_encoded);
      if (res < 0) {
        return res;
      }

      out_frame_len = res + 4;
      break;
    }

    case AMQP_FRAME_HEADER: {
      amqp_bytes_t properties_encoded;

      amqp_e16(frame->payload.properties.class_id,
               amqp_offset(out_frame, HEADER_SIZE));
      amqp_e16(0, amqp_offset(out_frame, HEADER_SIZE + 2)); /* "weight" */
      amqp_e64(frame->payload.properties.body_size,
               amqp_offset(out_frame, HEADER_SIZE + 4));

      properties_encoded.bytes = amqp_offset(out_frame, HEADER_SIZE + 12);
      properties_encoded.len = buffer.len - HEADER_SIZE - 12 - FOOTER_SIZE;

      res = amqp_encode_properties(frame->payload.properties.class_id,
                                   frame->payload.properties.decoded,
                                   properties_encoded);
      if (res < 0) {
        return res;
      }

      out_frame_len = res + 12;
      break;
    }

    case AMQP_FRAME_HEARTBEAT:
      out_frame_len = 0;
      break;

    default:
      return AMQP_STATUS_INVALID_PARAMETER;
  }

  amqp_e32((uint32_t)out_frame_len, amqp_offset(out_frame, 3));
  amqp_e8(AMQP_FRAME_END, amqp_offset(out_frame, HEADER_SIZE + out_frame_len));

  encoded->bytes = out_frame;
  encoded->len = out_frame_len + HEADER_SIZE + FOOTER_SIZE;

  return AMQP_STATUS_OK;
}